

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzchangeel.cpp
# Opt level: O1

int64_t TPZChangeEl::NearestNode(TPZGeoMesh *gmesh,TPZVec<double> *x,double tol)

{
  ulong uVar1;
  TPZGeoNode *this;
  ostream *poVar2;
  int c;
  long lVar3;
  int iVar4;
  ulong uVar5;
  ulong nelem;
  double dVar6;
  double dVar7;
  TPZVec<double> nodeCoord;
  TPZVec<double> local_50;
  
  TPZVec<double>::TPZVec(&local_50,3);
  uVar1 = (gmesh->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>.fNElements;
  if ((long)uVar1 < 1) {
    iVar4 = -1;
  }
  else {
    uVar5 = 0xffffffff;
    nelem = 0;
    do {
      this = TPZChunkVector<TPZGeoNode,_10>::operator[]
                       (&(gmesh->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>,nelem);
      TPZGeoNode::GetCoordinates(this,&local_50);
      dVar6 = 0.0;
      lVar3 = 0;
      do {
        dVar7 = x->fStore[lVar3] - local_50.fStore[lVar3];
        dVar6 = dVar6 + dVar7 * dVar7;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
      if (dVar6 < 0.0) {
        dVar6 = sqrt(dVar6);
      }
      else {
        dVar6 = SQRT(dVar6);
      }
      if (dVar6 <= tol) {
        uVar5 = nelem & 0xffffffff;
      }
      iVar4 = (int)uVar5;
    } while ((dVar6 > tol) && (nelem = nelem + 1, nelem != uVar1));
  }
  if (iVar4 != -1) {
    local_50._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
    if (local_50.fStore != (double *)0x0) {
      operator_delete__(local_50.fStore);
    }
    return (long)iVar4;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Node not found for coordinates ( ",0x21);
  poVar2 = std::ostream::_M_insert<double>(*x->fStore);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," , ",3);
  poVar2 = std::ostream::_M_insert<double>(x->fStore[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," , ",3);
  poVar2 = std::ostream::_M_insert<double>(x->fStore[2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," )",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"See ",4);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "static int64_t TPZChangeEl::NearestNode(TPZGeoMesh *, TPZVec<REAL> &, double)",0x4d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/SpecialMaps/tpzchangeel.cpp"
             ,0x206);
}

Assistant:

int64_t TPZChangeEl::NearestNode(TPZGeoMesh * gmesh, TPZVec<REAL> &x, double tol)
{
	int meshNode = -1;
	
	TPZVec<REAL> nodeCoord(3);
	int64_t nnodes = gmesh->NNodes();
	
	for(int64_t n = 0; n < nnodes; n++)
	{
		double dist = 0.;
		gmesh->NodeVec()[n].GetCoordinates(nodeCoord);
		for(int c = 0; c < 3; c++)
		{
			dist += (x[c] - nodeCoord[c])*(x[c] - nodeCoord[c]);
		}
		dist = sqrt(dist);
		
		if(dist <= tol)
		{
			meshNode = n;
			break;
		}
	}
	
	if(meshNode == -1)
	{
		std::cout << "Node not found for coordinates ( " << x[0] << " , " << x[1] << " , " << x[2] << " )" << std::endl;
		std::cout << "See " << __PRETTY_FUNCTION__ << std::endl;
		
		DebugStop();
	}
	
	return meshNode;
}